

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  ostream *poVar1;
  ColourImpl *pCVar2;
  char local_19;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    local_19 = ';';
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,&local_19,1);
    poVar1 = this->stream;
    pCVar2 = this->colourImpl;
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," expression was:",0x10);
    (*pCVar2->_vptr_ColourImpl[2])(pCVar2,0);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                stream << colourImpl->guardColour(compactDimColour) << " expression was:";
            }
            printOriginalExpression();
        }
    }